

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_utils.h
# Opt level: O1

uint GFMulHelper<unsigned_int,_32,_LFSR<BitsInt<unsigned_int,_32>,_141U>,_BitsInt<unsigned_int,_32>,_26>
     ::Run(uint *a,uint *b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long in_FS_OFFSET;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar11 = *a * 2;
  uVar2 = (int)*a >> 0x1f & 0x8dU ^ uVar11;
  uVar6 = uVar2 * 2;
  uVar7 = (int)uVar11 >> 0x1f & 0x8dU ^ uVar6;
  uVar11 = uVar7 * 2;
  uVar3 = (int)uVar6 >> 0x1f & 0x8dU ^ uVar11;
  uVar6 = uVar3 * 2;
  uVar8 = (int)uVar11 >> 0x1f & 0x8dU ^ uVar6;
  uVar11 = uVar8 * 2;
  uVar4 = (int)uVar6 >> 0x1f & 0x8dU ^ uVar11;
  uVar6 = uVar4 * 2;
  uVar9 = (int)uVar11 >> 0x1f & 0x8dU ^ uVar6;
  uVar11 = uVar9 * 2;
  uVar13 = (int)uVar6 >> 0x1f & 0x8dU ^ uVar11;
  uVar6 = uVar13 * 2;
  uVar10 = (int)uVar11 >> 0x1f & 0x8dU ^ uVar6;
  uVar11 = uVar10 * 2;
  uVar12 = (int)uVar6 >> 0x1f & 0x8dU ^ uVar11;
  uVar14 = uVar12 * 2;
  uVar11 = (int)uVar11 >> 0x1f & 0x8dU ^ uVar14;
  uVar6 = uVar11 * 2;
  uVar14 = (int)uVar14 >> 0x1f & 0x8dU ^ uVar6;
  uVar5 = (int)uVar6 >> 0x1f & 0x8dU ^ uVar14 * 2;
  local_3c = uVar5;
  uVar1 = GFMulHelper<unsigned_int,_32,_LFSR<BitsInt<unsigned_int,_32>,_141U>,_BitsInt<unsigned_int,_32>,_14>
          ::Run(&local_3c,b);
  uVar6 = *b;
  auVar15._4_4_ = uVar6;
  auVar15._0_4_ = uVar6;
  auVar15._8_4_ = uVar6;
  auVar15._12_4_ = uVar6;
  auVar16 = _DAT_00fdab70 & auVar15;
  auVar17._0_4_ = -(uint)(auVar16._0_4_ == 0);
  auVar17._4_4_ = -(uint)(auVar16._4_4_ == 0);
  auVar17._8_4_ = -(uint)(auVar16._8_4_ == 0);
  auVar17._12_4_ = -(uint)(auVar16._12_4_ == 0);
  uVar6 = movmskps(uVar5,auVar17);
  uVar5 = 0;
  if ((uVar6 & 8) != 0) {
    uVar14 = uVar5;
  }
  if ((uVar6 & 4) != 0) {
    uVar11 = uVar5;
  }
  if ((uVar6 & 2) != 0) {
    uVar12 = uVar5;
  }
  if ((uVar6 & 1) != 0) {
    uVar10 = uVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    auVar16 = auVar15 & _DAT_00fdab80;
    auVar15 = auVar15 & _DAT_00fdab90;
    return uVar14 ^ uVar1 ^
           uVar10 ^ uVar12 ^ uVar11 ^
           -(uint)(auVar16._12_4_ == DAT_00fdab80._12_4_) & uVar3 ^
           -(uint)(auVar15._12_4_ == DAT_00fdab90._12_4_) & uVar13 ^
           -(uint)(auVar16._4_4_ == DAT_00fdab80._4_4_) & uVar2 ^
           -(uint)(auVar15._4_4_ == DAT_00fdab90._4_4_) & uVar4 ^
           -(uint)(auVar16._8_4_ == DAT_00fdab80._8_4_) & *a ^
           -(uint)(auVar15._8_4_ == DAT_00fdab90._8_4_) & uVar9 ^
           -(uint)(auVar16._0_4_ == (int)DAT_00fdab80) & uVar7 ^
           -(uint)(auVar15._0_4_ == (int)DAT_00fdab90) & uVar8;
  }
  __stack_chk_fail();
}

Assistant:

static inline constexpr I Run(const I& a, const I& b) { return F::CondXorWith(GFMulHelper<I, N, L, F, K - 1>::Run(L::Call(a), b), F::template MidBits<N - K, 1>(b), a); }